

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcPpsUnit::deserialize(HevcPpsUnit *this)

{
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  VodCoreException *e;
  int rez;
  HevcPpsUnit *this_local;
  
  this_local._4_4_ = HevcUnit::deserialize(&this->super_HevcUnit);
  if (this_local._4_4_ == 0) {
    uVar3 = HevcUnit::extractUEGolombCode(&this->super_HevcUnit);
    this->pps_id = uVar3;
    if (this->pps_id < 0x40) {
      uVar3 = HevcUnit::extractUEGolombCode(&this->super_HevcUnit);
      this->sps_id = uVar3;
      if (this->sps_id < 0x10) {
        bVar1 = BitStreamReader::getBit(&(this->super_HevcUnit).m_reader);
        this->dependent_slice_segments_enabled_flag = bVar1;
        bVar1 = BitStreamReader::getBit(&(this->super_HevcUnit).m_reader);
        this->output_flag_present_flag = bVar1;
        uVar2 = BitStreamReader::getBits<unsigned_char>(&(this->super_HevcUnit).m_reader,3);
        this->num_extra_slice_header_bits = uVar2;
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int HevcPpsUnit::deserialize()
{
    const int rez = HevcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        pps_id = extractUEGolombCode();
        if (pps_id > 63)
            return 1;
        sps_id = extractUEGolombCode();
        if (sps_id > 15)
            return 1;
        dependent_slice_segments_enabled_flag = m_reader.getBit();
        output_flag_present_flag = m_reader.getBit();
        num_extra_slice_header_bits = m_reader.getBits<uint8_t>(3);

        return 0;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}